

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O3

u32 __thiscall moira::Moira::bcd<(moira::Instr)3,(moira::Size)1>(Moira *this,u32 op1,u32 op2)

{
  byte bVar1;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  u32 uVar3;
  
  uVar2 = (uint)(this->reg).sr.x + (op2 & 0xf) + (op1 & 0xf);
  uVar4 = (op2 & 0xf0) + (op1 & 0xf0) + uVar2;
  uVar5 = uVar4 + 6;
  if (uVar2 < 10) {
    uVar5 = uVar4;
  }
  uVar2 = uVar5 & 0x3f0;
  (this->reg).sr.c = 0x90 < uVar2;
  (this->reg).sr.x = 0x90 < uVar2;
  uVar3 = uVar5 + 0x60;
  if (uVar2 < 0x91) {
    uVar3 = uVar5;
  }
  bVar1 = (byte)uVar3;
  if (bVar1 != 0) {
    (this->reg).sr.z = false;
  }
  (this->reg).sr.v = -1 < (char)uVar4 && (char)bVar1 < '\0';
  (this->reg).sr.n = (bool)(bVar1 >> 7);
  return uVar3;
}

Assistant:

u32
Moira::bcd(u32 op1, u32 op2)
{
    u64 result;

    switch(I) {

        case ABCD:
        {
            // Extract nibbles
            u16 op1_hi = op1 & 0xF0, op1_lo = op1 & 0x0F;
            u16 op2_hi = op2 & 0xF0, op2_lo = op2 & 0x0F;

            // From portable68000
            u16 resLo = op1_lo + op2_lo + reg.sr.x;
            u16 resHi = op1_hi + op2_hi;
            u64 tmp_result;
            result = tmp_result = resHi + resLo;
            if (resLo > 9) result += 6;
            reg.sr.x = reg.sr.c = (result & 0x3F0) > 0x90;
            if (reg.sr.c) result += 0x60;
            if (CLIP<Byte>(result)) reg.sr.z = 0;
            reg.sr.n = NBIT<Byte>(result);
            reg.sr.v = ((tmp_result & 0x80) == 0) && ((result & 0x80) == 0x80);
            break;
        }
        case SBCD:
        {
            // Extract nibbles
            u16 op1_hi = op1 & 0xF0, op1_lo = op1 & 0x0F;
            u16 op2_hi = op2 & 0xF0, op2_lo = op2 & 0x0F;

            // From portable68000
            u16 resLo = op2_lo - op1_lo - reg.sr.x;
            u16 resHi = op2_hi - op1_hi;
            u64 tmp_result;
            result = tmp_result = resHi + resLo;
            int bcd = 0;
            if (resLo & 0xf0) {
                bcd = 6;
                result -= 6;
            }
            if (((op2 - op1 - reg.sr.x) & 0x100) > 0xff) result -= 0x60;
            reg.sr.c = reg.sr.x = ((op2 - op1 - bcd - reg.sr.x) & 0x300) > 0xff;

            if (CLIP<Byte>(result)) reg.sr.z = 0;
            reg.sr.n = NBIT<Byte>(result);
            reg.sr.v = ((tmp_result & 0x80) == 0x80) && ((result & 0x80) == 0);
            break;
        }
        default:
        {
            assert(false);
        }
    }
    reg.sr.n = NBIT<S>(result);
    return (u32)result;
}